

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O2

_Bool hpa_hugify_blocked_by_ndirty(tsdn_t *tsdn,hpa_shard_t *shard)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  hpdata_t *phVar5;
  size_t sVar6;
  
  phVar5 = duckdb_je_psset_pick_hugify
                     ((psset_t *)
                      ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow
                       .lg_fill_div + 8));
  if (phVar5 == (hpdata_t *)0x0) {
    bVar4 = false;
  }
  else {
    lVar1 = *(long *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins
                      [0x14].low_bits_low_water;
    lVar2 = *(long *)(tsdn[2].tsd.cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.
                      bin_flush_delay_items + 8);
    sVar3 = phVar5->h_ntouched;
    sVar6 = hpa_ndirty_max(tsdn,shard);
    bVar4 = sVar6 < (lVar1 - (lVar2 + sVar3)) + 0x200;
  }
  return bVar4;
}

Assistant:

static bool
hpa_hugify_blocked_by_ndirty(tsdn_t *tsdn, hpa_shard_t *shard) {
	malloc_mutex_assert_owner(tsdn, &shard->mtx);
	hpdata_t *to_hugify = psset_pick_hugify(&shard->psset);
	if (to_hugify == NULL) {
		return false;
	}
	return hpa_adjusted_ndirty(tsdn, shard)
	    + hpdata_nretained_get(to_hugify) > hpa_ndirty_max(tsdn, shard);
}